

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

Label * __thiscall wabt::anon_unknown_0::CWriter::FindLabel(CWriter *this,Var *var,bool mark_used)

{
  pointer pLVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __type _Var2;
  char *pcVar3;
  ulong uVar4;
  string *__rhs;
  long lVar5;
  undefined7 in_register_00000011;
  long lVar6;
  Label *pLVar7;
  
  if (var->type_ == Name) {
    uVar4 = ((long)(this->label_stack_).
                   super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30 & 0xffffffff;
    lVar6 = uVar4 * -0x30;
    pLVar7 = (Label *)0x0;
    lVar5 = uVar4 * 0x30;
    do {
      lVar6 = lVar6 + 0x30;
      if (lVar6 == 0x30) goto LAB_0014a910;
      pLVar1 = (this->label_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar7 = (Label *)((long)&pLVar1[-1].label_type + lVar5);
      __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               ((long)&pLVar1[-1].name + lVar5);
      __rhs = Var::name_abi_cxx11_(var);
      _Var2 = std::operator==(__lhs,__rhs);
      lVar5 = lVar5 + -0x30;
    } while (!_Var2);
    pLVar7 = (Label *)((long)pLVar1 - lVar6);
  }
  else {
    if (var->type_ != Index) {
      __assert_fail("var.is_name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x269,
                    "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)"
                   );
    }
    pcVar3 = Var::index(var,(char *)var,(int)CONCAT71(in_register_00000011,mark_used));
    pLVar7 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->label_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7) / 0x30 !=
        (ulong)((int)pcVar3 + 1)) {
      __assert_fail("var.index() + 1 == label_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x266,
                    "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)"
                   );
    }
LAB_0014a910:
    if (pLVar7 == (Label *)0x0) {
      __assert_fail("label",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x271,
                    "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)"
                   );
    }
  }
  if (mark_used) {
    pLVar7->used = true;
  }
  return pLVar7;
}

Assistant:

const Label* CWriter::FindLabel(const Var& var, bool mark_used) {
  Label* label = nullptr;

  if (var.is_index()) {
    // We've generated names for all labels, so we should only be using an
    // index when branching to the implicit function label, which can't be
    // named.
    assert(var.index() + 1 == label_stack_.size());
    label = &label_stack_[0];
  } else {
    assert(var.is_name());
    for (Index i = label_stack_.size(); i > 0; --i) {
      label = &label_stack_[i - 1];
      if (label->name == var.name())
        break;
    }
  }

  assert(label);
  if (mark_used) {
    label->used = true;
  }
  return label;
}